

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O1

void TryAllocExpectFail(size_t size)

{
  long lVar1;
  void *__ptr;
  char *pcVar2;
  code *local_28;
  
  local_28 = malloc;
  (*noopt_helper)(&local_28);
  lVar1 = (*local_28)(size);
  if (lVar1 == 0) {
    local_28 = malloc;
    (*noopt_helper)(&local_28);
    __ptr = (void *)(*local_28)(1);
    if (__ptr == (void *)0x0) {
      pcVar2 = "Check failed: p2 != nullptr\n";
    }
    else {
      local_28 = realloc;
      (*noopt_helper)(&local_28);
      lVar1 = (*local_28)(__ptr,size);
      if (lVar1 == 0) {
        free(__ptr);
        return;
      }
      pcVar2 = "Check failed: p3 == nullptr\n";
    }
  }
  else {
    pcVar2 = "Check failed: p1 == nullptr\n";
  }
  syscall(1,2,pcVar2,0x1c);
  abort();
}

Assistant:

void TryAllocExpectFail(size_t size) {
  void* p1 = noopt(malloc)(size);
  CHECK(p1 == nullptr);

  void* p2 = noopt(malloc)(1);
  CHECK(p2 != nullptr);

  void* p3 = noopt(realloc)(p2, size);
  CHECK(p3 == nullptr);

  free(p2);
}